

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cloud_cover.cpp
# Opt level: O2

ANNbool readPt(istream *in,int *p,int dim)

{
  ulong uVar1;
  long *plVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar4 = 0;
  uVar1 = 0;
  if (0 < dim) {
    uVar4 = (ulong)(uint)dim;
  }
  do {
    uVar3 = uVar1;
    if (uVar4 == uVar3) break;
    plVar2 = (long *)std::istream::operator>>((istream *)in,p);
    p = p + 1;
    uVar1 = uVar3 + 1;
  } while ((*(byte *)((long)plVar2 + *(long *)(*plVar2 + -0x18) + 0x20) & 5) == 0);
  return (ANNbool)((long)dim <= (long)uVar3);
}

Assistant:

ANNbool readPt(istream &in, int *p, int dim)  
{
    for (int i = 0; i < dim; i++) {
        if (!(in >> p[i])) return ANNfalse;
    }
    return ANNtrue;
}